

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_disable_msix(int device_fd)

{
  __off_t __offset;
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  void *pvVar8;
  int __timeout;
  epoll_event *__events;
  code *pcVar9;
  undefined4 uVar10;
  ulong uVar11;
  char *__buf;
  undefined1 *puVar12;
  epoll_event *peVar13;
  long lVar14;
  char *pcVar15;
  char irq_set_buf [152];
  char buf [512];
  undefined8 auStack_2e38 [2];
  size_t asStack_2e28 [67];
  long lStack_2c10;
  int iStack_2c08;
  uint uStack_2c04;
  undefined8 uStack_2c00;
  undefined1 auStack_2bf8 [512];
  stat sStack_29f8;
  char acStack_2968 [4096];
  char acStack_1968 [4096];
  ulong auStack_968 [3];
  epoll_event aeStack_94c [33];
  undefined8 uStack_738;
  undefined8 uStack_730;
  epoll_event aeStack_728 [32];
  undefined1 auStack_528 [8];
  ulong uStack_520;
  undefined1 *puStack_518;
  char *pcStack_510;
  char *pcStack_508;
  char *pcStack_500;
  code *pcStack_4f8;
  ulong uStack_4f0;
  int iStack_4e8;
  undefined4 uStack_4e4;
  undefined1 auStack_4e0 [520];
  ulong uStack_2d8;
  undefined1 local_208 [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar2 = ioctl(device_fd,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar12 = local_208;
  vfio_disable_msix_cold_1();
  pcVar15 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c";
  pcStack_4f8 = (code *)0x101daa;
  uStack_2d8 = (ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar9 = (code *)0x2;
  while( true ) {
    uVar11 = 0x3b6d;
    uStack_4f0 = 0x10;
    iVar4 = (int)pcVar9;
    uStack_4e4 = 0;
    pcStack_4f8 = (code *)0x101dde;
    iStack_4e8 = iVar4;
    iVar2 = ioctl((int)puVar12,0x3b6d,&uStack_4f0);
    if (iVar2 == -1) break;
    if ((uStack_4f0 & 0x100000000) != 0) goto LAB_00101e13;
    pcStack_4f8 = (code *)0x101e09;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    pcVar9 = (code *)(ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      pcVar9 = (code *)0xffffffff;
LAB_00101e13:
      return (int)pcVar9;
    }
  }
  iVar2 = (int)auStack_4e0;
  pcStack_4f8 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_1();
  pcStack_500 = "vfio_setup_interrupt";
  pcStack_508 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
  ;
  pcStack_510 = "[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n";
  lVar1 = -((uVar11 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_728 + lVar1);
  uStack_520 = (ulong)puVar12 & 0xffffffff;
  puStack_518 = (undefined1 *)&uStack_4f0;
  pcStack_4f8 = pcVar9;
  *(undefined8 *)((long)&uStack_730 + lVar1) = 0x101e6c;
  uVar3 = epoll_wait(iVar2,__events,(int)uVar11,__timeout);
  if (uVar3 != 0xffffffff) {
    pcVar15 = (char *)(ulong)uVar3;
    if (0 < (int)uVar3) {
      lVar14 = 0;
      do {
        iVar2 = *(int *)((long)aeStack_728 + lVar14 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_730 + lVar1) = 0x101e9c;
        sVar6 = read(iVar2,auStack_528,8);
        if (sVar6 == -1) {
          *(undefined8 *)((long)&uStack_730 + lVar1) = 0x101ec9;
          vfio_epoll_wait_cold_1();
          goto LAB_00101ec9;
        }
        lVar14 = lVar14 + 0xc;
      } while ((long)pcVar15 * 0xc != lVar14);
    }
    return uVar3;
  }
LAB_00101ec9:
  peVar13 = aeStack_728;
  *(code **)((long)&uStack_730 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_730 + lVar1) = &pcStack_4f8;
  *(epoll_event **)((long)&uStack_738 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_94c + lVar1) = 1;
  *(int *)((long)aeStack_94c + lVar1 + 4) = (int)peVar13;
  *(undefined8 *)((long)auStack_968 + lVar1 + 0x10) = 0x101ef3;
  uVar3 = epoll_create1(0);
  if (uVar3 == 0xffffffff) {
    *(undefined8 *)((long)auStack_968 + lVar1 + 0x10) = 0x101f28;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar3;
    *(undefined8 *)((long)auStack_968 + lVar1 + 0x10) = 0x101f0d;
    iVar2 = epoll_ctl(uVar3,1,(int)peVar13,(epoll_event *)((long)aeStack_94c + lVar1));
    if (iVar2 != -1) {
      return uVar3;
    }
  }
  lVar14 = (long)aeStack_94c + lVar1 + 0xc;
  *(code **)((long)auStack_968 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_968 + lVar1 + 0x10) = (ulong)peVar13 & 0xffffffff;
  *(char **)((long)auStack_968 + lVar1 + 8) = pcVar15;
  *(epoll_event **)((long)auStack_968 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101f61;
  snprintf(acStack_1968 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar14);
  *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101f71;
  iVar2 = stat(acStack_1968 + lVar1,(stat *)((long)&sStack_29f8 + lVar1));
  if (iVar2 < 0) {
    return -1;
  }
  pcVar15 = acStack_1968 + lVar1;
  *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101f89;
  sVar7 = strlen(pcVar15);
  *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101fa0;
  strncat(pcVar15,"iommu_group",0xfff - sVar7);
  __buf = acStack_2968 + lVar1;
  *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101fb5;
  sVar6 = readlink(pcVar15,__buf,0x1000);
  uVar10 = SUB84(__buf,0);
  if (sVar6 == -1) {
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10214a;
    vfio_init_cold_11();
LAB_0010214a:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102154;
    vfio_init_cold_10();
LAB_00102154:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10215e;
    vfio_init_cold_8();
LAB_0010215e:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102168;
    vfio_init_cold_7();
LAB_00102168:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102172;
    vfio_init_cold_6();
LAB_00102172:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10217c;
    vfio_init_cold_5();
LAB_0010217c:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102186;
    vfio_init_cold_3();
LAB_00102186:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102190;
    vfio_init_cold_9();
LAB_00102190:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10219a;
    vfio_init_cold_1();
LAB_0010219a:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x1021a4;
    vfio_init_cold_2();
  }
  else {
    acStack_2968[(int)sVar6 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101fd6;
    pcVar15 = __xpg_basename(acStack_2968 + lVar1);
    uVar10 = 0x1034ad;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101fec;
    iVar2 = __isoc99_sscanf(pcVar15,"%d",(long)&uStack_2c04 + lVar1);
    if (iVar2 == -1) goto LAB_0010214a;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x101ffc;
    iVar2 = get_vfio_container();
    *(int *)((long)&iStack_2c08 + lVar1) = iVar2;
    if (iVar2 == -1) {
      uVar10 = 2;
      *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102019;
      iVar4 = open("/dev/vfio/vfio",2);
      if (iVar4 == -1) goto LAB_00102186;
      *(int *)((long)&iStack_2c08 + lVar1) = iVar4;
      *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10202f;
      set_vfio_container(iVar4);
      uVar10 = 0x3b64;
      *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10203e;
      iVar5 = ioctl(iVar4,0x3b64);
      if (iVar5 != 0) goto LAB_00102190;
      uVar10 = 0x3b65;
      *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10205a;
      iVar4 = ioctl(iVar4,0x3b65,1);
      if (iVar4 == 1) goto LAB_00102063;
      goto LAB_0010219a;
    }
LAB_00102063:
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102085;
    snprintf(acStack_1968 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_2c04 + lVar1)
            );
    uVar10 = 2;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102094;
    iVar4 = open(acStack_1968 + lVar1,2);
    if (iVar4 == -1) goto LAB_00102154;
    uVar10 = 0x3b67;
    *(undefined8 *)((long)&uStack_2c00 + lVar1) = 8;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x1020ba;
    iVar5 = ioctl(iVar4,0x3b67);
    if (iVar5 == -1) goto LAB_0010215e;
    if ((auStack_2bf8[lVar1 + -4] & 1) == 0) goto LAB_00102168;
    uVar10 = 0x3b68;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x1020e0;
    iVar5 = ioctl(iVar4,0x3b68,(long)&iStack_2c08 + lVar1);
    if (iVar5 == -1) goto LAB_00102172;
    if (iVar2 != -1) {
LAB_0010210b:
      uVar10 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10211d;
      iVar2 = ioctl(iVar4,0x3b6a,lVar14);
      if (iVar2 != -1) {
        *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x10212b;
        vfio_enable_dma(iVar2);
        return iVar2;
      }
      goto LAB_0010217c;
    }
    uVar10 = 0x3b66;
    *(undefined8 *)((long)&lStack_2c10 + lVar1) = 0x102102;
    iVar2 = ioctl(*(int *)((long)&iStack_2c08 + lVar1),0x3b66,1);
    if (iVar2 != -1) goto LAB_0010210b;
  }
  iVar2 = (int)auStack_2bf8 + (int)lVar1;
  *(code **)((long)&lStack_2c10 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2c10 + lVar1) = lVar14;
  *(undefined8 *)((long)auStack_2e38 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_2e28 + lVar1) = 0;
  *(undefined8 *)((long)asStack_2e28 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_2e28 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_2e28 + lVar1) = uVar10;
  *(undefined8 *)((long)auStack_2e38 + lVar1) = 0x1021d9;
  iVar4 = ioctl(iVar2,0x3b6c);
  if (iVar4 != -1) {
    sVar7 = *(size_t *)((long)asStack_2e28 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_2e28 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_2e38 + lVar1) = 0x1021fc;
    pvVar8 = mmap((void *)0x0,sVar7,3,1,iVar2,__offset);
    if (pvVar8 != (void *)0xffffffffffffffff) goto LAB_00102213;
    *(undefined8 *)((long)auStack_2e38 + lVar1) = 0x10220c;
    vfio_map_region_cold_1();
  }
  pvVar8 = (void *)0xffffffffffffffff;
LAB_00102213:
  return (int)pvVar8;
}

Assistant:

int vfio_disable_msix(int device_fd) {
	info("Disable MSIX Interrupts");
	struct vfio_irq_set* irq_set;
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(struct vfio_irq_set);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSIX interrupt");

	return 0;
}